

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void Serialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
               (AutoFile *os,
               map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
               *m)

{
  _Base_ptr p_Var1;
  size_t in_RCX;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<AutoFile>(os,(m->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  p_Var1 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(m->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      AutoFile::write(os,(int)p_Var1 + 0x20,(void *)0x20,in_RCX);
      local_30 = *(undefined8 *)(p_Var1 + 2);
      AutoFile::write(os,(int)&local_30,&DAT_00000008,in_RCX);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::map<K, T, Pred, A>& m)
{
    WriteCompactSize(os, m.size());
    for (const auto& entry : m)
        Serialize(os, entry);
}